

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<std::_Rb_tree_const_iterator<int>const&>::
captureExpression<(Catch::Internal::Operator)1,std::_Rb_tree_const_iterator<int>>
          (ExpressionLhs<const_std::_Rb_tree_const_iterator<int>_&> *this,
          _Rb_tree_const_iterator<int> *rhs)

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  ExpressionResultBuilder *in_RDI;
  string *in_stack_ffffffffffffff38;
  ExpressionResultBuilder *in_stack_ffffffffffffff40;
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  result = Internal::
           compare<(Catch::Internal::Operator)1,std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                     ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff40,
                      (_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff38);
  ExpressionResultBuilder::setResultType(in_RDI,result);
  toString<std::_Rb_tree_const_iterator<int>>
            ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff38);
  ExpressionResultBuilder::setLhs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  toString<std::_Rb_tree_const_iterator<int>>
            ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff38);
  ExpressionResultBuilder::setRhs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pEVar1 = (ExpressionResultBuilder *)
           Internal::OperatorTraits<(Catch::Internal::Operator)1>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)pEVar1,&local_81);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }